

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ARGBMirrorRow_C(uint8_t *src,uint8_t *dst,int width)

{
  long lVar1;
  uint8_t *puVar2;
  uint32_t *src32;
  long lVar3;
  
  lVar1 = (long)width + -1;
  puVar2 = src + (long)width * 4 + -4;
  if (1 < width) {
    lVar3 = 0;
    do {
      *(undefined4 *)(dst + lVar3 * 4) = *(undefined4 *)puVar2;
      *(undefined4 *)(dst + lVar3 * 4 + 4) = *(undefined4 *)(puVar2 + -4);
      puVar2 = puVar2 + -8;
      lVar3 = lVar3 + 2;
    } while (lVar3 < lVar1);
  }
  if ((width & 1U) != 0) {
    *(undefined4 *)(dst + lVar1 * 4) = *(undefined4 *)puVar2;
  }
  return;
}

Assistant:

void ARGBMirrorRow_C(const uint8_t* src, uint8_t* dst, int width) {
  int x;
  const uint32_t* src32 = (const uint32_t*)(src);
  uint32_t* dst32 = (uint32_t*)(dst);
  src32 += width - 1;
  for (x = 0; x < width - 1; x += 2) {
    dst32[x] = src32[0];
    dst32[x + 1] = src32[-1];
    src32 -= 2;
  }
  if (width & 1) {
    dst32[width - 1] = src32[0];
  }
}